

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall
OpenSteer::Camera::smoothCameraMove
          (Camera *this,Vec3 *newPosition,Vec3 *newTarget,Vec3 *newUp,float elapsedTime)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  float in_XMM1_Da;
  Vec3 VVar4;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  if (this->smoothNextMove != true) {
    this->smoothNextMove = true;
    uVar1._0_4_ = newPosition->x;
    uVar1._4_4_ = newPosition->y;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
              (uVar1,newPosition->z,this);
    Vec3::operator=(&this->target,newTarget);
    uVar2._0_4_ = newUp->x;
    uVar2._4_4_ = newUp->y;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5])
              (uVar2,newUp->z,this);
    return;
  }
  fVar3 = elapsedTime * this->smoothMoveSpeed;
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
  local_40._0_8_ = extraout_XMM0_Qa;
  local_40.z = in_XMM1_Da;
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
  local_50._0_8_ = extraout_XMM0_Qa_00;
  local_50.z = in_XMM1_Da;
  blendIntoAccumulator<OpenSteer::Vec3>(fVar3,newPosition,&local_40);
  blendIntoAccumulator<OpenSteer::Vec3>(fVar3,newTarget,&this->target);
  blendIntoAccumulator<OpenSteer::Vec3>(fVar3,newUp,&local_50);
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
            (local_40._0_8_,local_40.z,this);
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5])
            (local_50._0_8_,this);
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
  if (((float)extraout_XMM0_Qa_01 == Vec3::zero.x) &&
     (!NAN((float)extraout_XMM0_Qa_01) && !NAN(Vec3::zero.x))) {
    fVar3 = (float)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    if ((fVar3 == Vec3::zero.y) && (!NAN(fVar3) && !NAN(Vec3::zero.y))) {
      if ((local_50.z == Vec3::zero.z) && (!NAN(local_50.z) && !NAN(Vec3::zero.z))) {
        VVar4.z = Vec3::up.z;
        VVar4.x = Vec3::up.x;
        VVar4.y = Vec3::up.y;
        goto LAB_0012adca;
      }
    }
  }
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
  VVar4 = Vec3::normalize(&local_60);
LAB_0012adca:
  (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5])
            (VVar4._0_8_,VVar4.z,this);
  return;
}

Assistant:

void 
OpenSteer::Camera::smoothCameraMove (const Vec3& newPosition,
                                     const Vec3& newTarget,
                                     const Vec3& newUp,
                                     const float elapsedTime)
{
    if (smoothNextMove)
    {
        const float smoothRate = elapsedTime * smoothMoveSpeed;

        Vec3 tempPosition = position();
        Vec3 tempUp = up();
        blendIntoAccumulator (smoothRate, newPosition, tempPosition);
        blendIntoAccumulator (smoothRate, newTarget,   target);
        blendIntoAccumulator (smoothRate, newUp,       tempUp);
        setPosition (tempPosition);
        setUp (tempUp);

        // xxx not sure if these are needed, seems like a good idea
        // xxx (also if either up or oldUP are zero, use the other?)
        // xxx (even better: force up to be perp to target-position axis))
        if (up() == Vec3::zero)
            setUp (Vec3::up);
        else
            setUp (up().normalize ());
    }
    else
    {
        smoothNextMove = true;

        setPosition (newPosition);
        target   = newTarget;
        setUp (newUp);
    }
}